

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# init.cc
# Opt level: O2

void cnn::Cleanup(void)

{
  operator_delete(rndeng);
  operator_delete(fxs);
  operator_delete(dEdfs);
  operator_delete(ps);
  return;
}

Assistant:

void Cleanup() {
  delete rndeng;
  delete fxs;
  delete dEdfs;
  delete ps;
}